

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

string * __thiscall
inja::Environment::render_file
          (string *__return_storage_ptr__,Environment *this,path *filename,json *data)

{
  Template local_a0;
  json *local_28;
  json *data_local;
  path *filename_local;
  Environment *this_local;
  
  local_28 = data;
  data_local = (json *)filename;
  filename_local = (path *)this;
  this_local = (Environment *)__return_storage_ptr__;
  parse_template(&local_a0,this,filename);
  render(__return_storage_ptr__,this,&local_a0,local_28);
  Template::~Template(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string render_file(const std::filesystem::path& filename, const json& data) {
    return render(parse_template(filename), data);
  }